

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void __thiscall LZ77Compressor::next(LZ77Compressor *this,uint8_t *input,int *i,int maxLen,int end)

{
  bool bVar1;
  char cVar2;
  short sVar3;
  int *in_RDX;
  int *in_RSI;
  LZ77Compressor *in_RDI;
  int in_R8D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  uint8_t *in_stack_00000008;
  LZ77Compressor *in_stack_00000010;
  int j;
  Item item;
  int matchLen;
  int matchOff;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar4;
  ushort in_stack_ffffffffffffffd0;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined2 uVar9;
  int local_28;
  short local_24;
  
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  bVar1 = search(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                 &in_RDI->maxMatch,in_RSI);
  if (bVar1) {
    uVar5 = 1;
    cVar2 = (char)local_28 + -3;
    sVar3 = ((short)*in_RDX - local_24) + -1;
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::push_back
              ((vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)
               CONCAT26(sVar3,CONCAT15(uVar8,CONCAT14(cVar2,CONCAT13(uVar7,CONCAT12(1,
                                                  in_stack_ffffffffffffffd0))))),
               (value_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    for (iVar4 = 0; iVar4 < local_28; iVar4 = iVar4 + 1) {
      if (in_RDI->windowLength <= *in_RDX + iVar4) {
        remove(in_RDI,(char *)in_RSI);
      }
      if (*in_RDX + iVar4 < in_R8D) {
        add((LZ77Compressor *)
            CONCAT26(sVar3,CONCAT15(uVar8,CONCAT14(cVar2,CONCAT13(uVar7,CONCAT12(uVar5,
                                                  in_stack_ffffffffffffffd0))))),
            (uint8_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),(int)((ulong)in_RDI >> 0x20));
      }
    }
    *in_RDX = local_28 + *in_RDX;
  }
  else {
    uVar6 = 0;
    uVar5 = *(undefined1 *)((long)in_RSI + (long)*in_RDX);
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::push_back
              ((vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)
               CONCAT26(uVar9,CONCAT15(uVar8,CONCAT14(uVar5,CONCAT13(uVar7,(uint3)
                                                  in_stack_ffffffffffffffd0)))),
               (value_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (in_RDI->windowLength <= *in_RDX) {
      remove(in_RDI,(char *)in_RSI);
    }
    add((LZ77Compressor *)
        CONCAT26(uVar9,CONCAT15(uVar8,CONCAT14(uVar5,CONCAT13(uVar7,CONCAT12(uVar6,
                                                  in_stack_ffffffffffffffd0))))),
        (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        (int)((ulong)in_RDI >> 0x20));
    *in_RDX = *in_RDX + 1;
  }
  return;
}

Assistant:

void next(const uint8_t* input, int& i, int maxLen, int end) {
		int matchOff, matchLen;
		Item item = {0};
		if (search(input, i, maxLen, matchOff, matchLen)) {
			item.isRepeat = true;
			item.length = matchLen - 3;
			item.offset = (i - matchOff) - 1;
			output.push_back(item);
			for (int j = 0; j < matchLen; j++) {
				if (i + j >= windowLength) {
					remove(input, i + j - windowLength);
				}
				if (i + j < end) {
					add(input, i + j);
				}
			}
			i += matchLen;
		} else {
			item.isRepeat = false;
			item.value = input[i];
			output.push_back(item);
			if (i >= windowLength) {
				remove(input, i - windowLength);
			}
			add(input, i);
			i++;
		}
	}